

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentImageAtomicCase::~ConcurrentImageAtomicCase
          (ConcurrentImageAtomicCase *this)

{
  ~ConcurrentImageAtomicCase(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

ConcurrentImageAtomicCase::~ConcurrentImageAtomicCase (void)
{
	deinit();
}